

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O2

int asn1_string_get_uint64(uint64_t *out,ASN1_STRING *a,int type)

{
  int iVar1;
  
  iVar1 = asn1_string_get_abs_uint64(out,a,type);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else if ((a->type & 0x100) == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    ERR_put_error(0xc,0,0xc4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                  ,0x133);
  }
  return iVar1;
}

Assistant:

static int asn1_string_get_uint64(uint64_t *out, const ASN1_STRING *a,
                                  int type) {
  if (!asn1_string_get_abs_uint64(out, a, type)) {
    return 0;
  }
  if (a->type & V_ASN1_NEG) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_INTEGER);
    return 0;
  }
  return 1;
}